

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O1

_Bool Open_JTalk_generate_sounddata
                (Open_JTalk *open_jtalk,char *txt,short **sounddata,size_t *size,
                size_t *sampling_frequency)

{
  NJD *njd;
  JPCommon *jpcommon;
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  HTS_Boolean HVar4;
  int iVar5;
  char **ppcVar6;
  short *psVar7;
  ulong uVar8;
  short sVar9;
  _Bool _Var10;
  size_t __nmemb;
  char buff [1024];
  char local_438 [1032];
  
  if (open_jtalk == (Open_JTalk *)0x0) {
    return false;
  }
  text2mecab(local_438,txt);
  Mecab_analysis(&open_jtalk->mecab,local_438);
  njd = &open_jtalk->njd;
  ppcVar6 = Mecab_get_feature(&open_jtalk->mecab);
  iVar5 = Mecab_get_size(&open_jtalk->mecab);
  mecab2njd(njd,ppcVar6,iVar5);
  njd_set_pronunciation(njd);
  njd_set_digit(njd);
  njd_set_accent_phrase(njd);
  njd_set_accent_type(njd);
  njd_set_unvoiced_vowel(njd);
  njd_set_long_vowel(njd);
  jpcommon = &open_jtalk->jpcommon;
  njd2jpcommon(jpcommon,njd);
  JPCommon_make_label(jpcommon);
  iVar5 = JPCommon_get_label_size(jpcommon);
  if (2 < iVar5) {
    ppcVar6 = JPCommon_get_label_feature(jpcommon);
    iVar5 = JPCommon_get_label_size(jpcommon);
    HVar4 = HTS_Engine_synthesize_from_strings(&open_jtalk->engine,ppcVar6,(long)iVar5);
    if (HVar4 == '\x01') {
      uVar2 = (open_jtalk->engine).gss.total_nsample;
      __nmemb = (uVar2 & 0xfffffffffffffc00) + 0x400;
      psVar7 = (short *)calloc(__nmemb,2);
      if (uVar2 != 0) {
        pdVar3 = (open_jtalk->engine).gss.gspeech;
        uVar8 = 0;
        do {
          dVar1 = pdVar3[uVar8];
          sVar9 = 0x7fff;
          if ((dVar1 <= 32767.0) && (sVar9 = -0x8000, -32768.0 <= dVar1)) {
            sVar9 = (short)(int)dVar1;
          }
          psVar7[uVar8] = sVar9;
          uVar8 = uVar8 + 1;
        } while ((uVar8 & 0xffffffff) < uVar2);
      }
      if (__nmemb - uVar2 != 0) {
        memset(psVar7 + uVar2,0,__nmemb - uVar2);
      }
      *sounddata = psVar7;
      *size = __nmemb;
      *sampling_frequency = (open_jtalk->engine).condition.sampling_frequency;
      _Var10 = true;
      goto LAB_001460d7;
    }
  }
  _Var10 = false;
LAB_001460d7:
  Open_JTalk_refresh(open_jtalk);
  return _Var10;
}

Assistant:

bool Open_JTalk_generate_sounddata(Open_JTalk *open_jtalk,
								   const char *txt,
								   short **sounddata,
								   size_t *size,
								   size_t *sampling_frequency)
{
	if (open_jtalk == NULL)
	{
		return false;
	}
	char buff[MAXBUFLEN];
	text2mecab(buff, txt);
	Mecab_analysis(&open_jtalk->mecab, buff);
	mecab2njd(&open_jtalk->njd, Mecab_get_feature(&open_jtalk->mecab),
			  Mecab_get_size(&open_jtalk->mecab));
	njd_set_pronunciation(&open_jtalk->njd);
	njd_set_digit(&open_jtalk->njd);
	njd_set_accent_phrase(&open_jtalk->njd);
	njd_set_accent_type(&open_jtalk->njd);
	njd_set_unvoiced_vowel(&open_jtalk->njd);
	njd_set_long_vowel(&open_jtalk->njd);
	njd2jpcommon(&open_jtalk->jpcommon, &open_jtalk->njd);
	JPCommon_make_label(&open_jtalk->jpcommon);
	if (JPCommon_get_label_size(&open_jtalk->jpcommon) > 2)
	{
		if (HTS_Engine_synthesize_from_strings(
				&open_jtalk->engine,
				JPCommon_get_label_feature(&open_jtalk->jpcommon), JPCommon_get_label_size(&open_jtalk->jpcommon)) == TRUE)
		{
			short temp;
			HTS_GStreamSet *gss = &open_jtalk->engine.gss;
			size_t len = (gss->total_nsample / OPEN_JTALK_BLOCKSIZE + 1) * OPEN_JTALK_BLOCKSIZE;
			short *data = (short *)calloc(len, sizeof(short));
			for (unsigned int i = 0; i < gss->total_nsample; i++)
			{
				double x = gss->gspeech[i];
				if (x > 32767.0)
				{
					temp = 32767;
				}
				else if (x < -32768.0)
				{
					temp = -32768;
				}
				else
				{
					temp = (short)x;
				}
				data[i] = temp;
			}
			if (len != gss->total_nsample)
			{
				memset(data + gss->total_nsample, '\0', len - gss->total_nsample);
			}
			*sounddata = data;
			*size = len;
			*sampling_frequency = (&open_jtalk->engine)->condition.sampling_frequency;
			Open_JTalk_refresh(open_jtalk);
			return true;
		}
	}
	Open_JTalk_refresh(open_jtalk);
	return false;
}